

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O3

void __thiscall PrintC::pushType(PrintC *this,Datatype *ct)

{
  string local_68;
  Atom local_48;
  
  (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6e])(this,ct,1);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  local_48.type = blanktoken;
  local_48.highlight = no_color;
  local_48.name = &local_68;
  PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6f])(this,ct);
  return;
}

Assistant:

void PrintC::pushType(const Datatype *ct)

{
  pushTypeStart(ct,true);				// Print type (as if for a cast)
  pushAtom(Atom("",blanktoken,EmitXml::no_color));
  pushTypeEnd(ct);
}